

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O1

void __thiscall despot::POMDPX::InitialBelief(POMDPX *this)

{
  string *in_RDX;
  State *in_RSI;
  
  InitialBelief((POMDPX *)&this[-1].memory_pool_.freelist_,in_RSI,in_RDX);
  return;
}

Assistant:

Belief* POMDPX::InitialBelief(const State* start, string type) const {
	vector<State*> particles;
	if (is_small_ && parser_->LogNumInitialStates() < 13) { // Small problem
		particles = ExactInitialParticleSet();
	} else {
		particles = ApproxInitialParticleSet();
	}

	Belief* belief = NULL;
	if (type == "noisy")
		belief = new POMDPXBelief(particles, 10, this);
	else // if (type == "particle")
		belief = new ParticleBelief(particles, this);
	return belief;
}